

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O2

void fill_advent_calendar(level *lev,boolean init)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  uint *puVar7;
  int otyp;
  char *line;
  boolean init_00;
  boolean artif;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  char buf [4];
  
  puVar6 = (uint *)&lev->locations[1][1].field_0x6;
  uVar8 = 1;
  lVar10 = 1;
  do {
    if (lVar10 == 0x50) {
      return;
    }
    puVar7 = puVar6;
    uVar9 = 0;
    while (uVar9 != 0x14) {
      uVar1 = uVar9 + 1;
      if (((int)uVar8 < 0x19) && (*(byte *)((long)puVar7 + -2) == 0x17)) {
        uVar2 = uVar9;
        if (9 < uVar1) {
          uVar2 = uVar9 + 2;
        }
        if (init != '\0') {
          if (uVar1 < 10) {
            uVar9 = uVar9 + 2;
          }
          sprintf(buf,"%d",(ulong)uVar8);
          iVar5 = (int)lVar10;
          make_engr_at(lev,iVar5,(int)uVar9,buf,0,'\x04');
          uVar3 = mt_random();
          if (uVar8 == 0x18) {
            otyp = *(int *)(&DAT_002a0378 + ((ulong)uVar3 % 0xf) * 4);
            init_00 = '\x01';
            artif = '\x01';
          }
          else {
            uVar4 = mt_random();
            if ((uVar3 & 3) == 0) {
              mkobj_at(((uVar4 & 3) == 0) * '\x02' + '\x04',lev,iVar5,(int)uVar2,'\0');
              goto LAB_001d3441;
            }
            otyp = ((uVar4 & 3) == 0) + 0x121;
            init_00 = '\0';
            artif = '\0';
          }
          mksobj_at(otyp,lev,iVar5,(int)uVar2,init_00,artif);
        }
LAB_001d3441:
        if ((*puVar7 & 0x80) != 0) {
          iVar5 = getmonth();
          if (iVar5 == 0xc) {
            iVar5 = getmday();
            line = "a little bell ringing!";
            if (uVar8 != 0x18 || iVar5 != 0x18) {
              uVar3 = getmday();
              line = "a door unlocking!";
              if (uVar3 != uVar8) goto LAB_001d348f;
            }
            You_hear(line);
            *puVar7 = *puVar7 & 0xfffffe0f | 0x40;
          }
        }
LAB_001d348f:
        uVar8 = uVar8 + 1;
      }
      puVar7 = puVar7 + 3;
      uVar9 = uVar1;
    }
    lVar10 = lVar10 + 1;
    puVar6 = puVar6 + 0x3f;
  } while( true );
}

Assistant:

void fill_advent_calendar(struct level *lev, boolean init)
{
    int door_nr = 1;
    char buf[4];
    int x, y;
    int in_x, in_y, out_x, out_y;

    for (x = 1; x < COLNO; x++) {
	for (y = 1; y < ROWNO; y++) {
	    if (door_nr < 25 && isok(x,y) && IS_DOOR(lev->locations[x][y].typ)) {
		if (y < 10) {
		    out_x = x; out_y = y+1; in_x = x; in_y = y-1;
		} else {
		    out_x = x; out_y = y-1; in_x = x; in_y = y+1;
		}
		if (init) {
		    sprintf(buf, "%d", door_nr);
		    /* place number in front of the door */
		    make_engr_at(lev, out_x, out_y, buf, 0L, MARK);
		    if (door_nr == 24) {
			int object = CANDY_BAR;
			/* Christmas present! */
			switch (rn2(15)) {
			case  0: object = BAG_OF_HOLDING; break;
			case  1: object = OILSKIN_SACK; break;
			case  2: object = FIRE_HORN; break;
			case  3: object = FROST_HORN; break;
			case  4: object = MAGIC_FLUTE; break;
			case  5: object = MAGIC_HARP; break;
			case  6: object = DRUM_OF_EARTHQUAKE; break;
			case  7: object = MAGIC_WHISTLE; break;
			case  8: object = MAGIC_LAMP; break;
			case  9: object = UNICORN_HORN; break;
			case 10: object = BAG_OF_TRICKS; break;
			case 11: object = EXPENSIVE_CAMERA; break;
			case 12: object = HORN_OF_PLENTY; break;
			case 13: object = STETHOSCOPE; break;
			case 14: object = TINNING_KIT; break;
			}
			mksobj_at(object, lev, in_x, in_y, TRUE, TRUE);
		    } else if (rn2(4)) {
			mksobj_at((rn2(4)) ? CANDY_BAR : FORTUNE_COOKIE,
				  lev, in_x, in_y, FALSE, FALSE);
		    } else {
			mkobj_at((rn2(4)) ? RING_CLASS : TOOL_CLASS,
				 lev, in_x, in_y, FALSE);
		    }
		}
		if (lev->locations[x][y].doormask & D_LOCKED && getmonth() == 12) {
		    if (getmday() == 24 && door_nr == 24) {
			You_hear("a little bell ringing!");
			lev->locations[x][y].doormask = D_CLOSED;
		    } else if (getmday() == door_nr) {
			You_hear("a door unlocking!");
			lev->locations[x][y].doormask = D_CLOSED;
		    }
		}
		door_nr++;
	    }
	}
    }
}